

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Nf_ManPreparePrint(int nVars,int *pComp,int *pPerm,char (*Line) [8])

{
  char cVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  char (*pacVar12) [8];
  int *piVar13;
  bool bVar14;
  int local_40;
  
  uVar3 = Extra_Factorial(nVars);
  uVar9 = 1 << ((byte)nVars & 0x1f);
  if (0 < nVars) {
    uVar5 = nVars + 0x40;
    uVar6 = 0;
    do {
      (*Line)[uVar6] = (char)uVar5;
      uVar6 = uVar6 + 1;
      uVar5 = (uint)(byte)((char)uVar5 - 1);
    } while ((uint)nVars != uVar6);
  }
  (*Line + nVars)[0] = '+';
  (*Line + nVars)[1] = '\0';
  uVar6 = 1;
  if (1 < (int)uVar9) {
    uVar6 = (ulong)uVar9;
  }
  iVar7 = 0;
  iVar8 = 0;
  do {
    Line[iVar7][nVars] = (iVar8 != 0) * '\x02' + '+';
    if (0 < (int)uVar3) {
      uVar11 = 0;
      do {
        iVar2 = iVar7;
        if (nVars != 0x1f) {
          local_40 = (int)uVar6;
          lVar10 = 0;
          piVar13 = pComp;
          do {
            strcpy(Line[(long)iVar7 + 1] + lVar10,Line[iVar7] + lVar10);
            bVar4 = Line[(long)iVar7 + 1][*piVar13 + lVar10];
            if ((byte)(bVar4 + 0xbf) < 0x1a) {
              bVar4 = bVar4 | 0x20;
LAB_003dfa5f:
              Line[(long)iVar7 + 1][lVar10 + *piVar13] = bVar4;
            }
            else if ((byte)(bVar4 + 0x9f) < 0x1a) {
              bVar4 = bVar4 - 0x20;
              goto LAB_003dfa5f;
            }
            piVar13 = piVar13 + 1;
            lVar10 = lVar10 + 8;
            iVar2 = iVar7 + local_40;
          } while (uVar6 * 8 - lVar10 != 0);
        }
        iVar7 = iVar2;
        lVar10 = (long)pPerm[uVar11];
        cVar1 = Line[iVar7][lVar10];
        Line[iVar7][lVar10] = Line[iVar7][lVar10 + 1];
        Line[iVar7][lVar10 + 1] = cVar1;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar3);
    }
    bVar14 = iVar8 != 0;
    iVar8 = iVar8 + 1;
    if (bVar14) {
      if (iVar7 != uVar3 * 2 << ((byte)nVars & 0x1f)) {
        __assert_fail("n == 2*nPerms*nMints",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                      ,0x511,"void Nf_ManPreparePrint(int, int *, int *, char (*)[8])");
      }
      uVar5 = 1;
      if (1 < (int)uVar9) {
        uVar5 = uVar9;
      }
      iVar8 = 0;
      uVar6 = 0;
      do {
        iVar7 = (int)uVar6;
        if (0 < (int)uVar3) {
          uVar11 = 0;
          do {
            if (nVars != 0x1f) {
              pacVar12 = Line + iVar8;
              uVar9 = 0;
              do {
                printf("%8d : %d %3d %2d : %s\n",(ulong)(uVar9 + iVar8),uVar6,uVar11,(ulong)uVar9,
                       pacVar12);
                uVar9 = uVar9 + 1;
                pacVar12 = pacVar12 + 1;
              } while (uVar5 != uVar9);
              iVar8 = iVar8 + uVar9;
            }
            uVar9 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar9;
          } while (uVar9 != uVar3);
        }
        uVar6 = (ulong)(iVar7 + 1);
      } while (iVar7 == 0);
      return;
    }
  } while( true );
}

Assistant:

void Nf_ManPreparePrint( int nVars, int * pComp, int * pPerm, char Line[2*720*64][8] )
{
    int nPerms = Extra_Factorial( nVars );
    int nMints = (1 << nVars);
    char * pChar, * pChar2;
    int i, p, c, n = 0;
    for ( i = 0; i < nVars; i++ )
        Line[0][i] = 'A' + nVars - 1 - i;
    Line[0][nVars] = '+';
    Line[0][nVars+1] = 0;
    for ( i = 0; i < 2; i++ )
    {
        Line[n][nVars] = i ? '-' : '+';
        for ( p = 0; p < nPerms; p++ )
        {
            for ( c = 0; c < nMints; c++ )
            {
                strcpy( Line[n+1], Line[n] ); n++;
                pChar = &Line[n][pComp[c]];
                if ( *pChar >= 'A' && *pChar <= 'Z' )
                    *pChar += 'a' - 'A';
                else if ( *pChar >= 'a' && *pChar <= 'z' )
                    *pChar -= 'a' - 'A';
            }
            pChar  = &Line[n][pPerm[p]];
            pChar2 = pChar + 1;
            ABC_SWAP( char, *pChar, *pChar2 );
        }
    }
    assert( n == 2*nPerms*nMints );
    n = 0;
    for ( i = 0; i < 2; i++ )
        for ( p = 0; p < nPerms; p++ )
            for ( c = 0; c < nMints; c++ )
                printf("%8d : %d %3d %2d : %s\n", n, i, p, c, Line[n]), n++;
}